

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::Run(CClient *this)

{
  float fVar1;
  long lVar2;
  long lVar3;
  NETADDR BindAddr_00;
  NETADDR BindAddr_01;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int64 iVar9;
  undefined8 uVar10;
  IEngineGraphics *pIVar11;
  IEngineSound *pIVar12;
  IGraphics *this_00;
  CConfig *pCVar13;
  IEngineInput *pIVar14;
  CServerBrowser *this_01;
  IGameClient *pIVar15;
  undefined4 extraout_var;
  CClient *this_02;
  undefined4 extraout_var_01;
  int64 iVar16;
  CClient *in_RDI;
  long in_FS_OFFSET;
  int64 Now;
  bool SkipFrame;
  bool IsLShiftPressed;
  bool IsCtrlPressed;
  int ActScreen;
  bool RegisterFail;
  char aBuf [256];
  NETADDR BindAddr;
  IGraphics *in_stack_fffffffffffffde8;
  char *pcVar17;
  NETADDR *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  int iVar18;
  undefined4 in_stack_fffffffffffffe1c;
  IConsole *in_stack_fffffffffffffe20;
  CConfig *in_stack_fffffffffffffe28;
  CNetClient *in_stack_fffffffffffffe30;
  char *buffer;
  byte local_182;
  undefined1 in_stack_fffffffffffffeb0 [16];
  CClient *in_stack_fffffffffffffec0;
  undefined4 uStack_1c;
  CClient *local_18;
  undefined4 extraout_var_00;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = time_get();
  in_RDI->m_LocalStartTime = iVar9;
  in_RDI->m_SnapshotParts = 0;
  iVar5 = SDL_Init(0);
  if (iVar5 < 0) {
    uVar10 = SDL_GetError();
    dbg_msg("client","unable to init SDL base: %s",uVar10);
    goto LAB_00126b80;
  }
  atexit(SDL_Quit);
  pIVar11 = CreateEngineGraphicsThreaded();
  in_RDI->m_pGraphics = pIVar11;
  IInterface::Kernel((IInterface *)in_RDI);
  bVar4 = IKernel::RegisterInterface<IEngineGraphics>
                    ((IKernel *)in_stack_fffffffffffffdf0,
                     (IEngineGraphics *)in_stack_fffffffffffffde8);
  local_182 = 1;
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    IInterface::Kernel((IInterface *)in_RDI);
    bVar4 = IKernel::RegisterInterface<IGraphics>
                      ((IKernel *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_182 = bVar4 ^ 0xff;
  }
  uVar6 = (uint)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  if (((local_182 & 1) != 0) ||
     (iVar5 = (*(in_RDI->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2b])(),
     iVar5 != 0)) {
    dbg_msg("client","couldn\'t init graphics");
    goto LAB_00126b80;
  }
  pIVar12 = Sound(in_RDI);
  iVar5 = (*(pIVar12->super_ISound).super_IInterface._vptr_IInterface[0xc])();
  in_RDI->m_SoundInitFailed = iVar5 != 0;
  pIVar12 = Sound(in_RDI);
  this_00 = &Graphics(in_RDI)->super_IGraphics;
  iVar5 = IGraphics::ScreenWidth(this_00);
  (*(pIVar12->super_ISound).super_IInterface._vptr_IInterface[6])(((float)iVar5 * 1.5) / 2.0);
  pCVar13 = Config(in_RDI);
  if (pCVar13->m_Bindaddr[0] == '\0') {
LAB_00125f6c:
    mem_zero(in_stack_fffffffffffffdf0,uVar6);
  }
  else {
    Config(in_RDI);
    iVar5 = net_host_lookup(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,uVar6);
    if (iVar5 != 0) goto LAB_00125f6c;
  }
  Config(in_RDI);
  Console(in_RDI);
  Engine(in_RDI);
  BindAddr_00._16_8_ = in_stack_fffffffffffffec0;
  BindAddr_00.type = in_stack_fffffffffffffeb0._0_4_;
  BindAddr_00.ip[0] = in_stack_fffffffffffffeb0[4];
  BindAddr_00.ip[1] = in_stack_fffffffffffffeb0[5];
  BindAddr_00.ip[2] = in_stack_fffffffffffffeb0[6];
  BindAddr_00.ip[3] = in_stack_fffffffffffffeb0[7];
  BindAddr_00.ip[4] = in_stack_fffffffffffffeb0[8];
  BindAddr_00.ip[5] = in_stack_fffffffffffffeb0[9];
  BindAddr_00.ip[6] = in_stack_fffffffffffffeb0[10];
  BindAddr_00.ip[7] = in_stack_fffffffffffffeb0[0xb];
  BindAddr_00.ip[8] = in_stack_fffffffffffffeb0[0xc];
  BindAddr_00.ip[9] = in_stack_fffffffffffffeb0[0xd];
  BindAddr_00.ip[10] = in_stack_fffffffffffffeb0[0xe];
  BindAddr_00.ip[0xb] = in_stack_fffffffffffffeb0[0xf];
  bVar4 = CNetClient::Open(in_stack_fffffffffffffe30,BindAddr_00,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe20,
                           (IEngine *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           in_stack_fffffffffffffe14);
  if (bVar4) {
    pcVar17 = (char *)CONCAT44(uStack_1c,3);
    Config(in_RDI);
    Console(in_RDI);
    Engine(in_RDI);
    BindAddr_01._16_8_ = in_stack_fffffffffffffec0;
    BindAddr_01.type = in_stack_fffffffffffffeb0._0_4_;
    BindAddr_01.ip[0] = in_stack_fffffffffffffeb0[4];
    BindAddr_01.ip[1] = in_stack_fffffffffffffeb0[5];
    BindAddr_01.ip[2] = in_stack_fffffffffffffeb0[6];
    BindAddr_01.ip[3] = in_stack_fffffffffffffeb0[7];
    BindAddr_01.ip[4] = in_stack_fffffffffffffeb0[8];
    BindAddr_01.ip[5] = in_stack_fffffffffffffeb0[9];
    BindAddr_01.ip[6] = in_stack_fffffffffffffeb0[10];
    BindAddr_01.ip[7] = in_stack_fffffffffffffeb0[0xb];
    BindAddr_01.ip[8] = in_stack_fffffffffffffeb0[0xc];
    BindAddr_01.ip[9] = in_stack_fffffffffffffeb0[0xd];
    BindAddr_01.ip[10] = in_stack_fffffffffffffeb0[0xe];
    BindAddr_01.ip[0xb] = in_stack_fffffffffffffeb0[0xf];
    bVar4 = CNetClient::Open(in_stack_fffffffffffffe30,BindAddr_01,in_stack_fffffffffffffe28,
                             in_stack_fffffffffffffe20,
                             (IEngine *)
                             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                             in_stack_fffffffffffffe14);
    if (bVar4) {
      (*(in_RDI->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x14])();
      pIVar14 = Input(in_RDI);
      (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[0x1a])();
      this_01 = (CServerBrowser *)MasterServer(in_RDI);
      uVar6 = CNetBase::NetType(&(in_RDI->m_ContactClient).super_CNetBase);
      (*(((IMasterServer *)&this_01->super_IServerBrowser)->super_IInterface)._vptr_IInterface[6])
                (this_01,(ulong)uVar6);
      pIVar15 = GameClient(in_RDI);
      (*(pIVar15->super_IInterface)._vptr_IInterface[4])();
      buffer = &stack0xfffffffffffffea8;
      pIVar15 = GameClient(in_RDI);
      iVar5 = (*(pIVar15->super_IInterface)._vptr_IInterface[0x13])();
      str_format(buffer,0x100,"netversion %s",CONCAT44(extraout_var,iVar5));
      (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (in_RDI->m_pConsole,0,"client",&stack0xfffffffffffffea8);
      pIVar15 = GameClient(in_RDI);
      iVar5 = (*(pIVar15->super_IInterface)._vptr_IInterface[0x14])();
      this_02 = (CClient *)CONCAT44(extraout_var_00,iVar5);
      pIVar15 = GameClient(in_RDI);
      (*(pIVar15->super_IInterface)._vptr_IInterface[0x15])();
      iVar5 = str_comp((char *)local_18,pcVar17);
      if (iVar5 != 0) {
        (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (in_RDI->m_pConsole,0,"client","WARNING: netversion hash differs");
      }
      pcVar17 = &stack0xfffffffffffffea8;
      pIVar15 = GameClient(in_RDI);
      iVar5 = (*(pIVar15->super_IInterface)._vptr_IInterface[0x12])();
      str_format(pcVar17,0x100,"game version %s",CONCAT44(extraout_var_01,iVar5));
      (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (in_RDI->m_pConsole,0,"client",&stack0xfffffffffffffea8);
      CGraph::Init(&in_RDI->m_FpsGraph,0.0,120.0);
      pCVar13 = Config(in_RDI);
      pCVar13->m_ClEditor = 0;
      (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x10])(in_RDI->m_pConsole,0);
LAB_0012635b:
      VersionUpdate((CClient *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      if (in_RDI->m_aCmdConnect[0] != '\0') {
        (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[2])
                  (in_RDI,in_RDI->m_aCmdConnect);
        in_RDI->m_aCmdConnect[0] = '\0';
      }
      pIVar14 = Input(in_RDI);
      iVar5 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[0x1b])();
      if (iVar5 != 0) goto LAB_00126b07;
      pIVar12 = Sound(in_RDI);
      (*(pIVar12->super_ISound).super_IInterface._vptr_IInterface[0xd])();
      iVar5 = (*(in_RDI->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])();
      if (iVar5 == 0) {
        if (in_RDI->m_WindowMustRefocus == 0) {
          pIVar14 = Input(in_RDI);
          (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[10])();
        }
        in_RDI->m_WindowMustRefocus = 1;
      }
      else {
        pCVar13 = Config(in_RDI);
        if (pCVar13->m_DbgFocus != 0) {
          pIVar14 = Input(in_RDI);
          uVar6 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[5])(pIVar14,0x1b,1);
          if ((uVar6 & 1) != 0) {
            pIVar14 = Input(in_RDI);
            (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[10])();
            in_RDI->m_WindowMustRefocus = 1;
          }
        }
      }
      if ((in_RDI->m_WindowMustRefocus != 0) &&
         (iVar5 = (*(in_RDI->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])
                            (), iVar5 != 0)) {
        if (in_RDI->m_WindowMustRefocus < 3) {
          pIVar14 = Input(in_RDI);
          (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[10])();
          in_RDI->m_WindowMustRefocus = in_RDI->m_WindowMustRefocus + 1;
        }
        if (in_RDI->m_WindowMustRefocus < 3) {
          pIVar14 = Input(in_RDI);
          uVar6 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[5])(pIVar14,0x19b,1);
          if ((uVar6 & 1) == 0) goto LAB_001265d6;
        }
        pIVar14 = Input(in_RDI);
        (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[9])();
        in_RDI->m_WindowMustRefocus = 0;
        pIVar11 = Graphics(in_RDI);
        iVar5 = (*(pIVar11->super_IGraphics).super_IInterface._vptr_IInterface[0x31])();
        if ((-1 < iVar5) &&
           (iVar18 = iVar5, pCVar13 = Config(in_RDI), iVar5 != pCVar13->m_GfxScreen)) {
          pCVar13 = Config(in_RDI);
          pCVar13->m_GfxScreen = iVar18;
        }
      }
LAB_001265d6:
      pIVar14 = Input(in_RDI);
      uVar6 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[4])(pIVar14,0x160);
      pIVar14 = Input(in_RDI);
      uVar7 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[4])(pIVar14,0x161);
      if (((uVar6 & 1) != 0) && ((uVar7 & 1) != 0)) {
        pIVar14 = Input(in_RDI);
        uVar8 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[5])(pIVar14,0x71,1);
        if ((uVar8 & 1) != 0) {
          (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[4])();
LAB_00126b07:
          pIVar15 = GameClient(in_RDI);
          (*(pIVar15->super_IInterface)._vptr_IInterface[8])();
          (*(in_RDI->super_IClient).super_IInterface._vptr_IInterface[3])();
          (*(in_RDI->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2c])();
          (*(in_RDI->m_pSound->super_ISound).super_IInterface._vptr_IInterface[0xe])();
          (*(in_RDI->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x16])();
          CServerBrowser::SaveServerlist(this_01);
          SDL_Quit();
          goto LAB_00126b80;
        }
      }
      if (((uVar6 & 1) != 0) && ((uVar7 & 1) != 0)) {
        pIVar14 = Input(in_RDI);
        uVar8 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[5])(pIVar14,100,1);
        if ((uVar8 & 1) != 0) {
          pCVar13 = Config(in_RDI);
          pCVar13->m_Debug = pCVar13->m_Debug ^ 1;
        }
      }
      if (((uVar6 & 1) != 0) && ((uVar7 & 1) != 0)) {
        pIVar14 = Input(in_RDI);
        uVar8 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[5])(pIVar14,0x67,1);
        if ((uVar8 & 1) != 0) {
          pCVar13 = Config(in_RDI);
          pCVar13->m_DbgGraphs = pCVar13->m_DbgGraphs ^ 1;
        }
      }
      if (((uVar6 & 1) != 0) && ((uVar7 & 1) != 0)) {
        pIVar14 = Input(in_RDI);
        uVar6 = (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[5])(pIVar14,0x65,1);
        if ((uVar6 & 1) != 0) {
          pCVar13 = Config(in_RDI);
          uVar6 = pCVar13->m_ClEditor ^ 1;
          pCVar13 = Config(in_RDI);
          pCVar13->m_ClEditor = uVar6;
          pIVar14 = Input(in_RDI);
          (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[9])();
        }
      }
      pCVar13 = Config(in_RDI);
      if (pCVar13->m_ClEditor == 0) {
        if ((in_RDI->m_EditorActive & 1U) != 0) {
          in_RDI->m_EditorActive = false;
        }
      }
      else if ((in_RDI->m_EditorActive & 1U) == 0) {
        pIVar15 = GameClient(in_RDI);
        (*(pIVar15->super_IInterface)._vptr_IInterface[0xf])();
        pIVar14 = Input(in_RDI);
        (*(pIVar14->super_IInput).super_IInterface._vptr_IInterface[9])();
        in_RDI->m_EditorActive = true;
      }
      (*(in_RDI->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x15])();
      Update(in_stack_fffffffffffffec0);
      bVar4 = LimitFps(this_02);
      if ((!bVar4) &&
         ((pCVar13 = Config(in_RDI), pCVar13->m_GfxAsyncRender == 0 ||
          (uVar6 = (*(in_RDI->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x29])
                             (), (uVar6 & 1) != 0)))) {
        in_RDI->m_RenderFrames = in_RDI->m_RenderFrames + 1;
        iVar9 = time_get();
        lVar3 = in_RDI->m_LastRenderTime;
        iVar16 = time_freq();
        (in_RDI->super_IClient).m_RenderFrameTime = (float)(iVar9 - lVar3) / (float)iVar16;
        if ((in_RDI->super_IClient).m_RenderFrameTime < in_RDI->m_RenderFrameTimeLow) {
          in_RDI->m_RenderFrameTimeLow = (in_RDI->super_IClient).m_RenderFrameTime;
        }
        fVar1 = (in_RDI->super_IClient).m_RenderFrameTime;
        if (in_RDI->m_RenderFrameTimeHigh <= fVar1 && fVar1 != in_RDI->m_RenderFrameTimeHigh) {
          in_RDI->m_RenderFrameTimeHigh = (in_RDI->super_IClient).m_RenderFrameTime;
        }
        CGraph::Add(&in_RDI->m_FpsGraph,1.0 / (in_RDI->super_IClient).m_RenderFrameTime,1.0,1.0,1.0)
        ;
        in_RDI->m_LastRenderTime = iVar9;
        pCVar13 = Config(in_RDI);
        if ((pCVar13->m_DbgStress == 0) || (in_RDI->m_RenderFrames % 10 == 0)) {
          Render(local_18);
          (*(in_RDI->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x26])();
        }
      }
      AutoScreenshot_Cleanup(in_RDI);
      iVar5 = IClient::State(&in_RDI->super_IClient);
      if (iVar5 == 5) goto LAB_00126b07;
      pCVar13 = Config(in_RDI);
      if (pCVar13->m_ClCpuThrottle == 0) {
        pCVar13 = Config(in_RDI);
        if ((pCVar13->m_DbgStress != 0) ||
           (iVar5 = (*(in_RDI->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34]
                    )(), iVar5 == 0)) {
          thread_sleep(0);
        }
      }
      else {
        Config(in_RDI);
        thread_sleep(0);
      }
      pCVar13 = Config(in_RDI);
      if (pCVar13->m_DbgHitch != 0) {
        Config(in_RDI);
        thread_sleep(0);
        pCVar13 = Config(in_RDI);
        pCVar13->m_DbgHitch = 0;
      }
      iVar9 = time_get();
      in_stack_fffffffffffffe0c = (float)(iVar9 - in_RDI->m_LocalStartTime);
      iVar9 = time_freq();
      (in_RDI->super_IClient).m_LocalTime = in_stack_fffffffffffffe0c / (float)iVar9;
      goto LAB_0012635b;
    }
    dbg_msg("client","couldn\'t open socket(contact)");
  }
  else {
    dbg_msg("client","couldn\'t open socket(net)");
  }
LAB_00126b80:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CClient::Run()
{
	m_LocalStartTime = time_get();
	m_SnapshotParts = 0;

	// init SDL
	{
		if(SDL_Init(0) < 0)
		{
			dbg_msg("client", "unable to init SDL base: %s", SDL_GetError());
			return;
		}

		atexit(SDL_Quit); // ignore_convention
	}

	// init graphics
	{
		m_pGraphics = CreateEngineGraphicsThreaded();

		bool RegisterFail = false;
		RegisterFail = RegisterFail || !Kernel()->RegisterInterface(static_cast<IEngineGraphics*>(m_pGraphics)); // register graphics as both
		RegisterFail = RegisterFail || !Kernel()->RegisterInterface(static_cast<IGraphics*>(m_pGraphics));

		if(RegisterFail || m_pGraphics->Init() != 0)
		{
			dbg_msg("client", "couldn't init graphics");
			return;
		}
	}

	// init sound, allowed to fail
	m_SoundInitFailed = Sound()->Init() != 0;
	Sound()->SetMaxDistance(1.5f*Graphics()->ScreenWidth()/2.0f);

	// open socket
	{
		NETADDR BindAddr;
		if(Config()->m_Bindaddr[0] && net_host_lookup(Config()->m_Bindaddr, &BindAddr, NETTYPE_ALL) == 0)
		{
			// got bindaddr
			BindAddr.type = NETTYPE_ALL;
		}
		else
		{
			mem_zero(&BindAddr, sizeof(BindAddr));
			BindAddr.type = NETTYPE_ALL;
		}
		if(!m_NetClient.Open(BindAddr, Config(), Console(), Engine(), BindAddr.port ? 0 : NETCREATE_FLAG_RANDOMPORT))
		{
			dbg_msg("client", "couldn't open socket(net)");
			return;
		}
		BindAddr.port = 0;
		if(!m_ContactClient.Open(BindAddr, Config(), Console(), Engine(), 0))
		{
			dbg_msg("client", "couldn't open socket(contact)");
			return;
		}
	}

	// init font rendering
	m_pTextRender->Init();

	// init the input
	Input()->Init();

	// start refreshing addresses while we load
	MasterServer()->RefreshAddresses(m_ContactClient.NetType());

	GameClient()->OnInit();

	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "netversion %s", GameClient()->NetVersion());
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);
	if(str_comp(GameClient()->NetVersionHashUsed(), GameClient()->NetVersionHashReal()))
	{
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", "WARNING: netversion hash differs");
	}
	str_format(aBuf, sizeof(aBuf), "game version %s", GameClient()->Version());
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);

	//
	m_FpsGraph.Init(0.0f, 120.0f);

	// never start with the editor
	Config()->m_ClEditor = 0;

	// process pending commands
	m_pConsole->StoreCommands(false);

	while (1)
	{
		//
		VersionUpdate();

		// handle pending connects
		if(m_aCmdConnect[0])
		{
			Connect(m_aCmdConnect);
			m_aCmdConnect[0] = 0;
		}

		// update input
		if(Input()->Update())
			break;	// SDL_QUIT

		// update sound
		Sound()->Update();

		// release focus
		if(!m_pGraphics->WindowActive())
		{
			if(m_WindowMustRefocus == 0)
				Input()->MouseModeAbsolute();
			m_WindowMustRefocus = 1;
		}
		else if (Config()->m_DbgFocus && Input()->KeyPress(KEY_ESCAPE, true))
		{
			Input()->MouseModeAbsolute();
			m_WindowMustRefocus = 1;
		}

		// refocus
		if(m_WindowMustRefocus && m_pGraphics->WindowActive())
		{
			if(m_WindowMustRefocus < 3)
			{
				Input()->MouseModeAbsolute();
				m_WindowMustRefocus++;
			}

			if(m_WindowMustRefocus >= 3 || Input()->KeyPress(KEY_MOUSE_1, true))
			{
				Input()->MouseModeRelative();
				m_WindowMustRefocus = 0;

				// update screen in case it got moved
				int ActScreen = Graphics()->GetWindowScreen();
				if(ActScreen >= 0 && ActScreen != Config()->m_GfxScreen)
					Config()->m_GfxScreen = ActScreen;
			}
		}

		// panic quit button
		bool IsCtrlPressed = Input()->KeyIsPressed(KEY_LCTRL);
		bool IsLShiftPressed = Input()->KeyIsPressed(KEY_LSHIFT);
		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_Q, true))
		{
			Quit();
			break;
		}

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_D, true))
			Config()->m_Debug ^= 1;

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_G, true))
			Config()->m_DbgGraphs ^= 1;

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_E, true))
		{
			Config()->m_ClEditor = Config()->m_ClEditor^1;
			Input()->MouseModeRelative();
		}

		// render
		{
			if(Config()->m_ClEditor)
			{
				if(!m_EditorActive)
				{
					GameClient()->OnActivateEditor();
					Input()->MouseModeRelative();
					m_EditorActive = true;
				}
			}
			else if(m_EditorActive)
				m_EditorActive = false;
			
			m_pTextRender->Update();

			Update();

			const bool SkipFrame = LimitFps();

			if(!SkipFrame && (!Config()->m_GfxAsyncRender || m_pGraphics->IsIdle()))
			{
				m_RenderFrames++;

				// update frametime
				int64 Now = time_get();
				m_RenderFrameTime = (Now - m_LastRenderTime) / (float)time_freq();

				if(m_RenderFrameTime < m_RenderFrameTimeLow)
					m_RenderFrameTimeLow = m_RenderFrameTime;
				if(m_RenderFrameTime > m_RenderFrameTimeHigh)
					m_RenderFrameTimeHigh = m_RenderFrameTime;
				m_FpsGraph.Add(1.0f/m_RenderFrameTime, 1,1,1);

				m_LastRenderTime = Now;

				// when we are stress testing only render every 10th frame
				if(!Config()->m_DbgStress || (m_RenderFrames%10) == 0 )
				{
					Render();
					m_pGraphics->Swap();
				}
			}
		}

		AutoScreenshot_Cleanup();

		// check conditions
		if(State() == IClient::STATE_QUITING)
			break;

		// beNice
		if(Config()->m_ClCpuThrottle)
			thread_sleep(Config()->m_ClCpuThrottle);
		else if(Config()->m_DbgStress || !m_pGraphics->WindowActive())
			thread_sleep(5);

		if(Config()->m_DbgHitch)
		{
			thread_sleep(Config()->m_DbgHitch);
			Config()->m_DbgHitch = 0;
		}

		/*
		if(ReportTime < time_get())
		{
			if(0 && Config()->m_Debug)
			{
				dbg_msg("client/report", "fps=%.02f (%.02f %.02f) netstate=%d",
					m_Frames/(float)(ReportInterval/time_freq()),
					1.0f/m_RenderFrameTimeHigh,
					1.0f/m_RenderFrameTimeLow,
					m_NetClient.State());
			}
			m_RenderFrameTimeLow = 1;
			m_RenderFrameTimeHigh = 0;
			m_RenderFrames = 0;
			ReportTime += ReportInterval;
		}*/

		// update local time
		m_LocalTime = (time_get()-m_LocalStartTime)/(float)time_freq();
	}

	GameClient()->OnShutdown();
	Disconnect();

	m_pGraphics->Shutdown();
	m_pSound->Shutdown();
	m_pTextRender->Shutdown();

	m_ServerBrowser.SaveServerlist();

	// shutdown SDL
	SDL_Quit();
}